

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O1

unsigned_short sxhash(LispPTR obj)

{
  OneDArray *obj_00;
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  uint uVar5;
  LispPTR LVar6;
  LispPTR LVar7;
  ulong uVar8;
  DLword *pDVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  
  uVar8 = (ulong)obj;
  uVar10 = 0;
LAB_001325d0:
  uVar11 = (uint)uVar8;
  if ((uVar11 & 0xfff0000 | 0x10000) != 0xf0000) {
    uVar5 = (uint)(uVar8 >> 9);
    uVar4 = *(ushort *)((ulong)(uVar5 * 2) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar4 == 0x13) goto code_r0x00132603;
    switch(uVar4) {
    case 2:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      uVar11 = (uint)Lisp_world[uVar8];
      break;
    case 3:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      uVar11 = *(uint *)(Lisp_world + uVar8) >> 0x10 ^ *(uint *)(Lisp_world + uVar8);
      break;
    default:
switchD_00132643_caseD_4:
      uVar11 = uVar5 & 0x7f ^ uVar11 << 3 ^ (uint)(uVar8 >> 0x10);
      break;
    case 5:
      iVar12 = 0xd;
      uVar11 = 0;
      goto LAB_001327f8;
    case 0xe:
    case 0x10:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      obj_00 = (OneDArray *)(Lisp_world + uVar8);
      uVar4 = *(ushort *)&obj_00->field_0x6;
      if ((uVar4 >> 0xc & 1) == 0) {
        if ((uVar4 >> 0xd & 1) == 0) goto switchD_00132643_caseD_4;
        uVar1 = sxhash_bitvec(obj_00);
        uVar11 = (uint)uVar1;
      }
      else {
        uVar11 = obj_00->fillpointer;
        uVar5 = 0xd;
        if (uVar11 < 0xd) {
          uVar5 = uVar11;
        }
        if ((char)uVar4 == 'D') {
          if (uVar11 == 0) goto LAB_001328f1;
          pDVar9 = Lisp_world + (ulong)obj_00->offset + (ulong)(*(uint *)obj_00 & 0xfffffff);
          uVar4 = 0;
          do {
            uVar4 = uVar4 ^ *(ushort *)((ulong)pDVar9 ^ 2);
            uVar4 = uVar4 << 7 | uVar4 >> 9;
            uVar11 = (uint)uVar4;
            pDVar9 = pDVar9 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        else {
          if ((char)uVar4 == 'C') {
            if (uVar11 != 0) {
              uVar8 = (long)Lisp_world +
                      (ulong)obj_00->offset + (ulong)(*(uint *)obj_00 & 0xfffffff) * 2;
              uVar11 = 0;
              do {
                uVar11 = (uint)(ushort)(((ushort)uVar11 ^ (ushort)*(byte *)(uVar8 ^ 3)) << 7 |
                                       (ushort)uVar11 >> 9);
                uVar8 = uVar8 + 1;
                uVar5 = uVar5 - 1;
              } while (uVar5 != 0);
              break;
            }
          }
          else {
            error("SXHASH of a string not made of chars!\n");
          }
LAB_001328f1:
          uVar11 = 0;
        }
      }
      break;
    case 0x11:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      LVar7 = *(LispPTR *)(Lisp_world + uVar8);
      LVar6 = car(LVar7);
      LVar7 = cdr(LVar7);
      LVar7 = car(LVar7);
      uVar11 = LVar7 * 0x1000 + LVar6;
      break;
    case 0x12:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      pDVar9 = Lisp_world;
      uVar1 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
      uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 2));
      uVar4 = uVar2 ^ uVar1;
      goto LAB_001328f7;
    case 0x14:
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      pDVar9 = Lisp_world;
      uVar1 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
      uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 2));
      uVar3 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 8));
      uVar4 = uVar3 ^ ((uVar2 ^ uVar1) << 7 | (uVar2 ^ uVar1) >> 9);
      uVar1 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 10));
      uVar4 = uVar1 ^ (uVar4 << 7 | uVar4 >> 9);
      uVar1 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 4));
      uVar4 = uVar1 ^ (uVar4 << 7 | uVar4 >> 9);
      uVar1 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 6));
      uVar4 = uVar1 ^ (uVar4 << 7 | uVar4 >> 9);
      uVar4 = uVar4 << 7 | uVar4 >> 9;
      goto LAB_001328f7;
    }
  }
  goto LAB_001328f4;
code_r0x00132603:
  if ((uVar8 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
  }
  pDVar9 = Lisp_world;
  uVar1 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
  uVar8 = (ulong)*(uint *)(pDVar9 + uVar8 + 2);
  uVar10 = uVar10 ^ uVar1;
  goto LAB_001325d0;
  while( true ) {
    LVar7 = car((LispPTR)uVar8);
    uVar1 = sxhash(LVar7);
    uVar4 = (ushort)uVar11 ^ uVar1;
    uVar11 = (uint)(ushort)(uVar4 << 7 | uVar4 >> 9);
    LVar7 = cdr((LispPTR)uVar8);
    uVar8 = (ulong)LVar7;
    iVar12 = iVar12 + -1;
    if (iVar12 == 0) break;
LAB_001327f8:
    if ((*(ushort *)((ulong)((uint)(uVar8 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5)
    break;
  }
LAB_001328f4:
  uVar4 = (ushort)uVar11;
LAB_001328f7:
  return uVar10 ^ uVar4;
}

Assistant:

static unsigned short sxhash(LispPTR obj) {
  /* unsigned short hashOffset; Not Used */
  unsigned int cell;
  OneDArray *str;
  switch (SEGMASK & obj) {
    case S_POSITIVE:
    case S_NEGATIVE: return (obj & 0xFFFF);
    default:
      switch (GetTypeNumber(obj)) {
        case TYPE_FIXP: return ((FIXP_VALUE(obj)) & 0xFFFF);
        case TYPE_FLOATP:
          cell = (unsigned int)FIXP_VALUE(obj);
          return ((cell & 0xFFFF) ^ (cell >> 16));
#ifdef BIGATOMS
        case TYPE_NEWATOM: /* as for LITATOM... */
#endif                     /* BIGATOMS */

        case TYPE_LITATOM: return (EQHASHINGBITS(obj));
        case TYPE_LISTP: return (sxhash_list(obj));
        case TYPE_PATHNAME: return (sxhash_pathname(obj));
        case TYPE_ONED_ARRAY:
        case TYPE_GENERAL_ARRAY:
          str = (OneDArray *)NativeAligned4FromLAddr(obj);
          if (str->stringp) return (sxhash_string(str));
          if (str->bitp) return (sxhash_bitvec(str));
          return (EQHASHINGBITS(obj));
        case TYPE_BIGNUM: {
          LispPTR contents;
          contents = ((BIGNUM *)NativeAligned4FromLAddr(obj))->contents;
          return ((unsigned short)car(contents) + (((unsigned short)car(cdr(contents))) << 12));
        }

        case TYPE_COMPLEX: {
          COMPLEX *object;
          object = (COMPLEX *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->real) ^ sxhash(object->imaginary));
        }
        case TYPE_RATIO: {
          RATIO *object;
          object = (RATIO *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->numerator) ^ sxhash(object->denominator));
        }

        default: return (EQHASHINGBITS(obj));
      }
  }
}